

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall EPoller::EPoller(EPoller *this)

{
  int iVar1;
  LogStream *this_00;
  Logger local_1000;
  allocator<epoll_event> local_11;
  EPoller *local_10;
  EPoller *this_local;
  
  local_10 = this;
  noncopyable::noncopyable((noncopyable *)this);
  iVar1 = epoll_create1(0x80000);
  this->epollfd_ = iVar1;
  std::allocator<epoll_event>::allocator(&local_11);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->events_,0x1000,&local_11);
  std::allocator<epoll_event>::~allocator(&local_11);
  std::
  unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
  ::unordered_map(&this->channels_);
  if (this->epollfd_ < 0) {
    Logger::Logger(&local_1000,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                   ,0xb);
    this_00 = Logger::stream(&local_1000);
    LogStream::operator<<(this_00,"Error: Epoller");
    Logger::~Logger(&local_1000);
  }
  return;
}

Assistant:

EPoller::EPoller() : epollfd_(epoll_create1(EPOLL_CLOEXEC)), events_(kEventInit) {
    if (epollfd_ < 0) {
        LOG << "Error: Epoller";
    }
}